

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O3

bool __thiscall
HullLibrary::CleanupVertices
          (HullLibrary *this,uint svcount,cbtVector3 *svertices,uint stride,uint *vcount,
          cbtVector3 *vertices,cbtScalar normalepsilon,cbtVector3 *scale)

{
  undefined8 uVar1;
  void *ptr;
  bool bVar2;
  float fVar3;
  ulong uVar4;
  undefined8 uVar5;
  byte bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  void *pvVar14;
  cbtVector3 *pcVar15;
  cbtScalar *pcVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  cbtScalar bmax_1 [3];
  cbtScalar bmin_1 [3];
  cbtScalar bmax [3];
  cbtScalar bmin [3];
  uint local_c8;
  uint uStack_c4;
  float fStack_c0;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint local_a8;
  uint uStack_a4;
  float fStack_a0;
  uint local_98;
  uint uStack_94;
  float fStack_90;
  undefined1 auVar30 [16];
  
  if (svcount != 0) {
    lVar19 = (long)*(int *)(this + 0x24);
    if (lVar19 < 0) {
      pvVar14 = *(void **)(this + 0x30);
      if (*(int *)(this + 0x28) < 0) {
        if (pvVar14 == (void *)0x0) {
          this[0x38] = (HullLibrary)0x1;
        }
        else {
          if (this[0x38] == (HullLibrary)0x1) {
            cbtAlignedFreeInternal(pvVar14);
          }
          this[0x38] = (HullLibrary)0x1;
          *(undefined8 *)(this + 0x30) = 0;
        }
        pvVar14 = (void *)0x0;
        *(undefined4 *)(this + 0x28) = 0;
      }
      memset((void *)((long)pvVar14 + lVar19 * 4),0,lVar19 * -4);
    }
    auVar30._8_4_ = 0x3f800000;
    auVar30._0_8_ = 0x3f8000003f800000;
    auVar30._12_4_ = 0x3f800000;
    *(undefined4 *)(this + 0x24) = 0;
    *vcount = 0;
    uVar1 = vmovlps_avx(auVar30);
    *(undefined8 *)scale->m_floats = uVar1;
    scale->m_floats[2] = 1.0;
    local_98 = 0x7f7fffff;
    uStack_94 = 0x7f7fffff;
    fStack_90 = 3.4028235e+38;
    fStack_a0 = -3.4028235e+38;
    local_a8 = 0xff7fffff;
    uStack_a4 = 0xff7fffff;
    pcVar15 = svertices;
    uVar12 = svcount;
    do {
      auVar40 = *(undefined1 (*) [16])pcVar15->m_floats;
      auVar23._0_12_ = auVar40._0_12_;
      auVar23._12_4_ = 0;
      auVar24._4_4_ = uStack_94;
      auVar24._0_4_ = local_98;
      auVar24._8_4_ = fStack_90;
      auVar24._12_4_ = 0;
      auVar28._4_4_ = uStack_a4;
      auVar28._0_4_ = local_a8;
      auVar28._8_4_ = fStack_a0;
      auVar28._12_4_ = 0;
      pcVar15 = (cbtVector3 *)((long)pcVar15->m_floats + (ulong)stride);
      uVar12 = uVar12 - 1;
      uVar1 = vcmpps_avx512vl(auVar23,auVar24,1);
      bVar6 = (byte)uVar1;
      local_98 = (uint)(bVar6 & 1) * auVar40._0_4_ | !(bool)(bVar6 & 1) * local_98;
      bVar2 = (bool)((bVar6 & 2) >> 1);
      uStack_94 = (uint)bVar2 * auVar40._4_4_ | !bVar2 * uStack_94;
      bVar2 = (bool)((bVar6 & 4) >> 2);
      fStack_90 = (float)((uint)bVar2 * auVar40._8_4_ | (uint)!bVar2 * (int)fStack_90);
      uVar1 = vcmpps_avx512vl(auVar28,auVar23,1);
      bVar6 = (byte)uVar1;
      local_a8 = (uint)(bVar6 & 1) * auVar40._0_4_ | !(bool)(bVar6 & 1) * local_a8;
      bVar2 = (bool)((bVar6 & 2) >> 1);
      uStack_a4 = (uint)bVar2 * auVar40._4_4_ | !bVar2 * uStack_a4;
      bVar2 = (bool)((bVar6 & 4) >> 2);
      fStack_a0 = (float)((uint)bVar2 * auVar40._8_4_ | (uint)!bVar2 * (int)fStack_a0);
    } while (uVar12 != 0);
    auVar40._4_4_ = uStack_a4;
    auVar40._0_4_ = local_a8;
    auVar40._8_8_ = 0;
    fStack_a0 = fStack_a0 - fStack_90;
    auVar35._4_4_ = uStack_94;
    auVar35._0_4_ = local_98;
    auVar35._8_8_ = 0;
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)fStack_90),ZEXT416((uint)fStack_a0),ZEXT416(0x3f000000))
    ;
    auVar40 = vsubps_avx(auVar40,auVar35);
    auVar41._8_4_ = 0x3f000000;
    auVar41._0_8_ = 0x3f0000003f000000;
    auVar41._12_4_ = 0x3f000000;
    auVar24 = vfmadd231ps_avx512vl(auVar35,auVar40,auVar41);
    auVar44._8_4_ = 0x358637bd;
    auVar44._0_8_ = 0x358637bd358637bd;
    auVar44._12_4_ = 0x358637bd;
    uVar17 = vcmpps_avx512vl(auVar40,auVar44,1);
    fVar22 = auVar23._0_4_;
    if ((((svcount < 3) || ((uVar17 & 1) != 0)) || ((uVar17 >> 1 & 1) != 0)) || (fStack_a0 < 1e-06))
    {
      auVar28 = SUB6416(ZEXT464(0x358637bd),0);
      uVar1 = vcmpss_avx512f(auVar28,auVar40,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar30 = vminss_avx(auVar40,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar12 = (uint)bVar2 * auVar30._0_4_ + (uint)!bVar2 * 0x7f7fffff;
      auVar23 = vmovshdup_avx(auVar40);
      auVar30 = vminss_avx(auVar23,ZEXT416(uVar12));
      uVar1 = vcmpss_avx512f(auVar28,auVar23,1);
      bVar2 = (bool)((byte)uVar1 & 1);
      uVar12 = (uint)bVar2 * auVar30._0_4_ + !bVar2 * uVar12;
      uVar1 = vcmpps_avx512vl(auVar28,ZEXT416((uint)fStack_a0),1);
      uVar5 = vcmpps_avx512vl(ZEXT416((uint)fStack_a0),ZEXT416(uVar12),1);
      bVar6 = (byte)uVar1 & (byte)uVar5;
      fVar34 = (float)((uint)(bVar6 & 1) * (int)fStack_a0 + !(bool)(bVar6 & 1) * uVar12);
      if ((fVar34 != 3.4028235e+38) || (NAN(fVar34))) {
        auVar10._8_4_ = 0x358637bd;
        auVar10._0_8_ = 0x358637bd358637bd;
        auVar10._12_4_ = 0x358637bd;
        uVar17 = vcmpps_avx512vl(auVar40,auVar10,1);
        auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar34 * 0.05)));
        bVar2 = (bool)((byte)uVar17 & 1);
        auVar29._0_4_ = (uint)bVar2 * auVar30._0_4_ | (uint)!bVar2 * auVar40._0_4_;
        bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar29._4_4_ = (uint)bVar2 * auVar30._4_4_ | (uint)!bVar2 * auVar40._4_4_;
        bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar29._8_4_ = (uint)bVar2 * auVar30._8_4_ | (uint)!bVar2 * auVar40._8_4_;
        bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar29._12_4_ = (uint)bVar2 * auVar30._12_4_ | (uint)!bVar2 * auVar40._12_4_;
        fVar34 = fVar34 * 0.05;
        if (1e-06 <= fStack_a0) {
          fVar34 = fStack_a0;
        }
      }
      else {
        auVar29._8_4_ = 0x3c23d70a;
        auVar29._0_8_ = 0x3c23d70a3c23d70a;
        auVar29._12_4_ = 0x3c23d70a;
        fVar34 = 0.01;
      }
      auVar23 = vsubps_avx(auVar24,auVar29);
      auVar36._0_4_ = auVar24._0_4_ + auVar29._0_4_;
      auVar36._4_4_ = auVar24._4_4_ + auVar29._4_4_;
      auVar36._8_4_ = auVar24._8_4_ + auVar29._8_4_;
      auVar36._12_4_ = auVar24._12_4_ + auVar29._12_4_;
      fVar3 = fVar22 - fVar34;
      fVar22 = fVar22 + fVar34;
      auVar30 = vmovshdup_avx(auVar23);
      auVar40 = vmovshdup_avx(auVar36);
      uVar1 = vmovlps_avx(auVar23);
      *(undefined8 *)vertices->m_floats = uVar1;
      vertices->m_floats[2] = fVar3;
      vertices[1].m_floats[1] = auVar30._0_4_;
      vertices[1].m_floats[2] = fVar3;
      vertices[1].m_floats[0] = auVar36._0_4_;
      uVar1 = vmovlps_avx(auVar36);
      *(undefined8 *)vertices[2].m_floats = uVar1;
      vertices[2].m_floats[2] = fVar3;
      vertices[3].m_floats[0] = auVar23._0_4_;
      vertices[3].m_floats[1] = auVar40._0_4_;
      vertices[3].m_floats[2] = fVar3;
      uVar1 = vmovlps_avx(auVar23);
      *(undefined8 *)vertices[4].m_floats = uVar1;
      vertices[4].m_floats[2] = fVar22;
      vertices[5].m_floats[0] = auVar36._0_4_;
      vertices[5].m_floats[1] = auVar30._0_4_;
      vertices[5].m_floats[2] = fVar22;
      uVar1 = vmovlps_avx(auVar36);
      *(undefined8 *)vertices[6].m_floats = uVar1;
      vertices[6].m_floats[2] = fVar22;
      vertices[7].m_floats[0] = auVar23._0_4_;
      vertices[7].m_floats[1] = auVar40._0_4_;
      vertices[7].m_floats[2] = fVar22;
    }
    else {
      auVar30 = vdivps_avx(auVar30,auVar40);
      uVar1 = vmovlps_avx(auVar40);
      *(undefined8 *)scale->m_floats = uVar1;
      auVar46 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      auVar45._4_4_ = normalepsilon;
      auVar45._0_4_ = normalepsilon;
      auVar45._8_4_ = normalepsilon;
      auVar45._12_4_ = normalepsilon;
      scale->m_floats[2] = fStack_a0;
      uVar12 = 0;
      fVar34 = auVar30._0_4_ * auVar24._0_4_;
      fVar22 = fVar22 * (1.0 / fStack_a0);
      do {
        uVar13 = *vcount;
        uVar17 = (ulong)uVar13;
        uVar21 = 0;
        auVar43._0_4_ = auVar30._0_4_ * (float)*(undefined8 *)svertices->m_floats;
        auVar43._4_4_ = auVar30._4_4_ * (float)((ulong)*(undefined8 *)svertices->m_floats >> 0x20);
        auVar43._8_4_ = auVar30._8_4_ * 0.0;
        auVar43._12_4_ = auVar30._12_4_ * 0.0;
        fVar3 = (1.0 / fStack_a0) * svertices->m_floats[2];
        if (uVar17 == 0) {
LAB_008ed070:
          uVar20 = (uint)uVar21;
          if (uVar20 == uVar13) goto LAB_008ed075;
        }
        else {
          uVar21 = 0;
          pcVar16 = vertices->m_floats + 2;
          do {
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)((cbtVector3 *)(pcVar16 + -2))->m_floats;
            auVar40 = vsubps_avx(auVar37,auVar43);
            auVar40 = vandps_avx(auVar46._0_16_,auVar40);
            uVar4 = vcmpps_avx512vl(auVar40,auVar45,1);
            if (((uVar4 & 1) != 0) && ((uVar4 >> 1 & 1) != 0)) {
              auVar40 = vandps_avx(auVar46._0_16_,ZEXT416((uint)(*pcVar16 - fVar3)));
              if (auVar40._0_4_ < normalepsilon) {
                auVar11._4_4_ = auVar30._4_4_ * auVar24._4_4_;
                auVar11._0_4_ = fVar34;
                auVar11._8_4_ = auVar30._8_4_ * auVar24._8_4_;
                auVar11._12_4_ = auVar30._12_4_ * auVar24._12_4_;
                auVar40 = vsubps_avx(auVar43,auVar11);
                auVar42._0_4_ = auVar40._0_4_ * auVar40._0_4_;
                auVar42._4_4_ = auVar40._4_4_ * auVar40._4_4_;
                auVar42._8_4_ = auVar40._8_4_ * auVar40._8_4_;
                auVar42._12_4_ = auVar40._12_4_ * auVar40._12_4_;
                auVar40 = vmovshdup_avx(auVar42);
                auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)(auVar43._0_4_ - fVar34)),
                                          ZEXT416((uint)(auVar43._0_4_ - fVar34)));
                auVar23 = ZEXT416((uint)(fVar3 - fVar22));
                auVar23 = vfmadd231ss_fma(auVar40,auVar23,auVar23);
                auVar40 = vsubps_avx(auVar37,auVar11);
                auVar38._0_4_ = auVar40._0_4_ * auVar40._0_4_;
                auVar38._4_4_ = auVar40._4_4_ * auVar40._4_4_;
                auVar38._8_4_ = auVar40._8_4_ * auVar40._8_4_;
                auVar38._12_4_ = auVar40._12_4_ * auVar40._12_4_;
                auVar40 = vmovshdup_avx(auVar38);
                auVar28 = ZEXT416((uint)((float)*(ulong *)((cbtVector3 *)(pcVar16 + -2))->m_floats -
                                        fVar34));
                auVar40 = vfmadd231ss_fma(auVar40,auVar28,auVar28);
                auVar28 = ZEXT416((uint)(*pcVar16 - fVar22));
                auVar40 = vfmadd231ss_fma(auVar40,auVar28,auVar28);
                if (auVar40._0_4_ < auVar23._0_4_) {
                  uVar1 = vmovlps_avx(auVar43);
                  *(undefined8 *)((cbtVector3 *)(pcVar16 + -2))->m_floats = uVar1;
                  *pcVar16 = fVar3;
                }
                goto LAB_008ed070;
              }
            }
            uVar21 = uVar21 + 1;
            pcVar16 = pcVar16 + 4;
            uVar20 = uVar13;
          } while (uVar17 != uVar21);
LAB_008ed075:
          uVar1 = vmovlps_avx(auVar43);
          *(undefined8 *)vertices[uVar17].m_floats = uVar1;
          vertices[uVar17].m_floats[2] = fVar3;
          *vcount = uVar13 + 1;
        }
        uVar13 = *(uint *)(this + 0x24);
        if (uVar13 == *(uint *)(this + 0x28)) {
          iVar18 = uVar13 * 2;
          if (uVar13 == 0) {
            iVar18 = 1;
          }
          if ((int)uVar13 < iVar18) {
            if (iVar18 == 0) {
              pvVar14 = (void *)0x0;
            }
            else {
              pvVar14 = cbtAlignedAllocInternal((long)iVar18 << 2,0x10);
              auVar46 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              uVar13 = *(uint *)(this + 0x24);
            }
            ptr = *(void **)(this + 0x30);
            if ((int)uVar13 < 1) {
              if (ptr != (void *)0x0) goto LAB_008ed12c;
            }
            else {
              uVar17 = 0;
              do {
                *(undefined4 *)((long)pvVar14 + uVar17 * 4) =
                     *(undefined4 *)((long)ptr + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar13 != uVar17);
LAB_008ed12c:
              if (this[0x38] == (HullLibrary)0x1) {
                cbtAlignedFreeInternal(ptr);
                auVar46 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
              }
              uVar13 = *(uint *)(this + 0x24);
            }
            this[0x38] = (HullLibrary)0x1;
            *(void **)(this + 0x30) = pvVar14;
            *(int *)(this + 0x28) = iVar18;
          }
        }
        svertices = (cbtVector3 *)((long)svertices->m_floats + (ulong)stride);
        uVar12 = uVar12 + 1;
        *(uint *)(*(long *)(this + 0x30) + (long)(int)uVar13 * 4) = uVar20;
        *(int *)(this + 0x24) = *(int *)(this + 0x24) + 1;
      } while (uVar12 != svcount);
      uStack_b0 = 0x7f7fffff;
      fStack_c0 = -3.4028235e+38;
      local_b8 = 0x7f7fffff;
      uStack_b4 = 0x7f7fffff;
      local_c8 = 0xff7fffff;
      uStack_c4 = 0xff7fffff;
      uVar12 = *vcount;
      if ((ulong)uVar12 == 0) {
        auVar32._8_4_ = 0x7f7fffff;
        auVar32._0_8_ = 0x7f7fffff7f7fffff;
        auVar32._12_4_ = 0x7f7fffff;
        auVar39._8_4_ = 0xff7fffff;
        auVar39._0_8_ = 0xff7fffffff7fffff;
        auVar39._12_4_ = 0xff7fffff;
        fStack_c0 = -3.4028235e+38;
        auVar30 = SUB6416(ZEXT464(0x7f7fffff),0);
      }
      else {
        lVar19 = 0;
        do {
          auVar30 = *(undefined1 (*) [16])((long)vertices->m_floats + lVar19);
          auVar25._0_12_ = auVar30._0_12_;
          auVar25._12_4_ = 0;
          auVar26._4_4_ = uStack_b4;
          auVar26._0_4_ = local_b8;
          auVar26._8_4_ = uStack_b0;
          auVar26._12_4_ = 0;
          auVar27._4_4_ = uStack_c4;
          auVar27._0_4_ = local_c8;
          auVar27._8_4_ = fStack_c0;
          auVar27._12_4_ = 0;
          lVar19 = lVar19 + 0x10;
          uVar1 = vcmpps_avx512vl(auVar25,auVar26,1);
          bVar6 = (byte)uVar1;
          local_b8 = (uint)(bVar6 & 1) * auVar30._0_4_ | !(bool)(bVar6 & 1) * local_b8;
          bVar2 = (bool)((bVar6 & 2) >> 1);
          uStack_b4 = (uint)bVar2 * auVar30._4_4_ | !bVar2 * uStack_b4;
          bVar2 = (bool)((bVar6 & 4) >> 2);
          uStack_b0 = (uint)bVar2 * auVar30._8_4_ | !bVar2 * uStack_b0;
          uVar1 = vcmpps_avx512vl(auVar27,auVar25,1);
          bVar6 = (byte)uVar1;
          local_c8 = (uint)(bVar6 & 1) * auVar30._0_4_ | !(bool)(bVar6 & 1) * local_c8;
          bVar2 = (bool)((bVar6 & 2) >> 1);
          uStack_c4 = (uint)bVar2 * auVar30._4_4_ | !bVar2 * uStack_c4;
          bVar2 = (bool)((bVar6 & 4) >> 2);
          fStack_c0 = (float)((uint)bVar2 * auVar30._8_4_ | (uint)!bVar2 * (int)fStack_c0);
        } while ((ulong)uVar12 << 4 != lVar19);
        auVar39._4_4_ = uStack_c4;
        auVar39._0_4_ = local_c8;
        auVar39._8_8_ = 0;
        auVar32._4_4_ = uStack_b4;
        auVar32._0_4_ = local_b8;
        auVar32._8_8_ = 0;
        auVar30 = ZEXT416(uStack_b0);
      }
      auVar40 = vsubps_avx(auVar39,auVar32);
      auVar7._8_4_ = 0x358637bd;
      auVar7._0_8_ = 0x358637bd358637bd;
      auVar7._12_4_ = 0x358637bd;
      uVar17 = vcmpps_avx512vl(auVar40,auVar7,1);
      fStack_c0 = fStack_c0 - auVar30._0_4_;
      if ((((2 < uVar12) && ((uVar17 & 1) == 0)) && ((uVar17 >> 1 & 1) == 0)) &&
         (1e-06 <= fStack_c0)) goto LAB_008ed558;
      auVar8._8_4_ = 0x3f000000;
      auVar8._0_8_ = 0x3f0000003f000000;
      auVar8._12_4_ = 0x3f000000;
      auVar28 = vfmadd231ps_avx512vl(auVar32,auVar40,auVar8);
      auVar44 = SUB6416(ZEXT464(0x358637bd),0);
      uVar1 = vcmpss_avx512f(auVar44,auVar40,2);
      bVar2 = (bool)((byte)uVar1 & 1);
      auVar41 = ZEXT416((uint)fStack_c0);
      auVar24 = vfmadd231ss_fma(auVar30,auVar41,ZEXT416(0x3f000000));
      auVar30 = vminss_avx(auVar40,SUB6416(ZEXT464(0x7f7fffff),0));
      uVar12 = (uint)bVar2 * auVar30._0_4_ + (uint)!bVar2 * 0x7f7fffff;
      auVar23 = vmovshdup_avx(auVar40);
      auVar30 = vminss_avx(auVar23,ZEXT416(uVar12));
      uVar1 = vcmpss_avx512f(auVar44,auVar23,2);
      bVar2 = (bool)((byte)uVar1 & 1);
      uVar12 = (uint)bVar2 * auVar30._0_4_ + !bVar2 * uVar12;
      uVar1 = vcmpps_avx512vl(auVar44,auVar41,2);
      uVar5 = vcmpps_avx512vl(auVar41,ZEXT416(uVar12),1);
      bVar6 = (byte)uVar1 & (byte)uVar5;
      fVar22 = (float)((uint)(bVar6 & 1) * (int)fStack_c0 + !(bool)(bVar6 & 1) * uVar12);
      if ((fVar22 != 3.4028235e+38) || (NAN(fVar22))) {
        auVar9._8_4_ = 0x358637bd;
        auVar9._0_8_ = 0x358637bd358637bd;
        auVar9._12_4_ = 0x358637bd;
        uVar17 = vcmpps_avx512vl(auVar40,auVar9,1);
        auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar22 * 0.05)));
        bVar2 = (bool)((byte)uVar17 & 1);
        auVar31._0_4_ = (uint)bVar2 * auVar30._0_4_ | (uint)!bVar2 * auVar40._0_4_;
        bVar2 = (bool)((byte)(uVar17 >> 1) & 1);
        auVar31._4_4_ = (uint)bVar2 * auVar30._4_4_ | (uint)!bVar2 * auVar40._4_4_;
        bVar2 = (bool)((byte)(uVar17 >> 2) & 1);
        auVar31._8_4_ = (uint)bVar2 * auVar30._8_4_ | (uint)!bVar2 * auVar40._8_4_;
        bVar2 = (bool)((byte)(uVar17 >> 3) & 1);
        auVar31._12_4_ = (uint)bVar2 * auVar30._12_4_ | (uint)!bVar2 * auVar40._12_4_;
        fVar22 = fVar22 * 0.05;
        if (1e-06 <= fStack_c0) {
          fVar22 = fStack_c0;
        }
      }
      else {
        auVar31._8_4_ = 0x3c23d70a;
        auVar31._0_8_ = 0x3c23d70a3c23d70a;
        auVar31._12_4_ = 0x3c23d70a;
        fVar22 = 0.01;
      }
      auVar23 = vsubps_avx(auVar28,auVar31);
      auVar33._0_4_ = auVar28._0_4_ + auVar31._0_4_;
      auVar33._4_4_ = auVar28._4_4_ + auVar31._4_4_;
      auVar33._8_4_ = auVar28._8_4_ + auVar31._8_4_;
      auVar33._12_4_ = auVar28._12_4_ + auVar31._12_4_;
      fVar34 = auVar24._0_4_ - fVar22;
      fVar22 = auVar24._0_4_ + fVar22;
      auVar30 = vmovshdup_avx(auVar23);
      auVar40 = vmovshdup_avx(auVar33);
      uVar1 = vmovlps_avx(auVar23);
      *(undefined8 *)vertices->m_floats = uVar1;
      vertices->m_floats[2] = fVar34;
      vertices[1].m_floats[1] = auVar30._0_4_;
      vertices[1].m_floats[2] = fVar34;
      vertices[1].m_floats[0] = auVar33._0_4_;
      uVar1 = vmovlps_avx(auVar33);
      *(undefined8 *)vertices[2].m_floats = uVar1;
      vertices[2].m_floats[2] = fVar34;
      vertices[3].m_floats[0] = auVar23._0_4_;
      vertices[3].m_floats[1] = auVar40._0_4_;
      vertices[3].m_floats[2] = fVar34;
      uVar1 = vmovlps_avx(auVar23);
      *(undefined8 *)vertices[4].m_floats = uVar1;
      vertices[4].m_floats[2] = fVar22;
      vertices[5].m_floats[0] = auVar33._0_4_;
      vertices[5].m_floats[1] = auVar30._0_4_;
      vertices[5].m_floats[2] = fVar22;
      uVar1 = vmovlps_avx(auVar33);
      *(undefined8 *)vertices[6].m_floats = uVar1;
      vertices[6].m_floats[2] = fVar22;
      vertices[7].m_floats[0] = auVar23._0_4_;
      vertices[7].m_floats[1] = auVar40._0_4_;
      vertices[7].m_floats[2] = fVar22;
    }
    *vcount = 8;
  }
LAB_008ed558:
  return svcount != 0;
}

Assistant:

bool HullLibrary::CleanupVertices(unsigned int svcount,
								  const cbtVector3 *svertices,
								  unsigned int stride,
								  unsigned int &vcount,  // output number of vertices
								  cbtVector3 *vertices,   // location to store the results.
								  cbtScalar normalepsilon,
								  cbtVector3 &scale)
{
	if (svcount == 0) return false;

	m_vertexIndexMapping.resize(0);

#define EPSILON cbtScalar(0.000001) /* close enough to consider two cbtScalaring point numbers to be 'the same'. */

	vcount = 0;

	cbtScalar recip[3] = {0.f, 0.f, 0.f};

	if (scale)
	{
		scale[0] = 1;
		scale[1] = 1;
		scale[2] = 1;
	}

	cbtScalar bmin[3] = {FLT_MAX, FLT_MAX, FLT_MAX};
	cbtScalar bmax[3] = {-FLT_MAX, -FLT_MAX, -FLT_MAX};

	const char *vtx = (const char *)svertices;

	//	if ( 1 )
	{
		for (unsigned int i = 0; i < svcount; i++)
		{
			const cbtScalar *p = (const cbtScalar *)vtx;

			vtx += stride;

			for (int j = 0; j < 3; j++)
			{
				if (p[j] < bmin[j]) bmin[j] = p[j];
				if (p[j] > bmax[j]) bmax[j] = p[j];
			}
		}
	}

	cbtScalar dx = bmax[0] - bmin[0];
	cbtScalar dy = bmax[1] - bmin[1];
	cbtScalar dz = bmax[2] - bmin[2];

	cbtVector3 center;

	center[0] = dx * cbtScalar(0.5) + bmin[0];
	center[1] = dy * cbtScalar(0.5) + bmin[1];
	center[2] = dz * cbtScalar(0.5) + bmin[2];

	if (dx < EPSILON || dy < EPSILON || dz < EPSILON || svcount < 3)
	{
		cbtScalar len = FLT_MAX;

		if (dx > EPSILON && dx < len) len = dx;
		if (dy > EPSILON && dy < len) len = dy;
		if (dz > EPSILON && dz < len) len = dz;

		if (len == FLT_MAX)
		{
			dx = dy = dz = cbtScalar(0.01);  // one centimeter
		}
		else
		{
			if (dx < EPSILON) dx = len * cbtScalar(0.05);  // 1/5th the shortest non-zero edge.
			if (dy < EPSILON) dy = len * cbtScalar(0.05);
			if (dz < EPSILON) dz = len * cbtScalar(0.05);
		}

		cbtScalar x1 = center[0] - dx;
		cbtScalar x2 = center[0] + dx;

		cbtScalar y1 = center[1] - dy;
		cbtScalar y2 = center[1] + dy;

		cbtScalar z1 = center[2] - dz;
		cbtScalar z2 = center[2] + dz;

		addPoint(vcount, vertices, x1, y1, z1);
		addPoint(vcount, vertices, x2, y1, z1);
		addPoint(vcount, vertices, x2, y2, z1);
		addPoint(vcount, vertices, x1, y2, z1);
		addPoint(vcount, vertices, x1, y1, z2);
		addPoint(vcount, vertices, x2, y1, z2);
		addPoint(vcount, vertices, x2, y2, z2);
		addPoint(vcount, vertices, x1, y2, z2);

		return true;  // return cube
	}
	else
	{
		if (scale)
		{
			scale[0] = dx;
			scale[1] = dy;
			scale[2] = dz;

			recip[0] = 1 / dx;
			recip[1] = 1 / dy;
			recip[2] = 1 / dz;

			center[0] *= recip[0];
			center[1] *= recip[1];
			center[2] *= recip[2];
		}
	}

	vtx = (const char *)svertices;

	for (unsigned int i = 0; i < svcount; i++)
	{
		const cbtVector3 *p = (const cbtVector3 *)vtx;
		vtx += stride;

		cbtScalar px = p->getX();
		cbtScalar py = p->getY();
		cbtScalar pz = p->getZ();

		if (scale)
		{
			px = px * recip[0];  // normalize
			py = py * recip[1];  // normalize
			pz = pz * recip[2];  // normalize
		}

		//		if ( 1 )
		{
			unsigned int j;

			for (j = 0; j < vcount; j++)
			{
				/// XXX might be broken
				cbtVector3 &v = vertices[j];

				cbtScalar x = v[0];
				cbtScalar y = v[1];
				cbtScalar z = v[2];

				cbtScalar dx = cbtFabs(x - px);
				cbtScalar dy = cbtFabs(y - py);
				cbtScalar dz = cbtFabs(z - pz);

				if (dx < normalepsilon && dy < normalepsilon && dz < normalepsilon)
				{
					// ok, it is close enough to the old one
					// now let us see if it is further from the center of the point cloud than the one we already recorded.
					// in which case we keep this one instead.

					cbtScalar dist1 = GetDist(px, py, pz, center);
					cbtScalar dist2 = GetDist(v[0], v[1], v[2], center);

					if (dist1 > dist2)
					{
						v[0] = px;
						v[1] = py;
						v[2] = pz;
					}

					break;
				}
			}

			if (j == vcount)
			{
				cbtVector3 &dest = vertices[vcount];
				dest[0] = px;
				dest[1] = py;
				dest[2] = pz;
				vcount++;
			}
			m_vertexIndexMapping.push_back(j);
		}
	}

	// ok..now make sure we didn't prune so many vertices it is now invalid.
	//	if ( 1 )
	{
		cbtScalar bmin[3] = {FLT_MAX, FLT_MAX, FLT_MAX};
		cbtScalar bmax[3] = {-FLT_MAX, -FLT_MAX, -FLT_MAX};

		for (unsigned int i = 0; i < vcount; i++)
		{
			const cbtVector3 &p = vertices[i];
			for (int j = 0; j < 3; j++)
			{
				if (p[j] < bmin[j]) bmin[j] = p[j];
				if (p[j] > bmax[j]) bmax[j] = p[j];
			}
		}

		cbtScalar dx = bmax[0] - bmin[0];
		cbtScalar dy = bmax[1] - bmin[1];
		cbtScalar dz = bmax[2] - bmin[2];

		if (dx < EPSILON || dy < EPSILON || dz < EPSILON || vcount < 3)
		{
			cbtScalar cx = dx * cbtScalar(0.5) + bmin[0];
			cbtScalar cy = dy * cbtScalar(0.5) + bmin[1];
			cbtScalar cz = dz * cbtScalar(0.5) + bmin[2];

			cbtScalar len = FLT_MAX;

			if (dx >= EPSILON && dx < len) len = dx;
			if (dy >= EPSILON && dy < len) len = dy;
			if (dz >= EPSILON && dz < len) len = dz;

			if (len == FLT_MAX)
			{
				dx = dy = dz = cbtScalar(0.01);  // one centimeter
			}
			else
			{
				if (dx < EPSILON) dx = len * cbtScalar(0.05);  // 1/5th the shortest non-zero edge.
				if (dy < EPSILON) dy = len * cbtScalar(0.05);
				if (dz < EPSILON) dz = len * cbtScalar(0.05);
			}

			cbtScalar x1 = cx - dx;
			cbtScalar x2 = cx + dx;

			cbtScalar y1 = cy - dy;
			cbtScalar y2 = cy + dy;

			cbtScalar z1 = cz - dz;
			cbtScalar z2 = cz + dz;

			vcount = 0;  // add box

			addPoint(vcount, vertices, x1, y1, z1);
			addPoint(vcount, vertices, x2, y1, z1);
			addPoint(vcount, vertices, x2, y2, z1);
			addPoint(vcount, vertices, x1, y2, z1);
			addPoint(vcount, vertices, x1, y1, z2);
			addPoint(vcount, vertices, x2, y1, z2);
			addPoint(vcount, vertices, x2, y2, z2);
			addPoint(vcount, vertices, x1, y2, z2);

			return true;
		}
	}

	return true;
}